

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

bool __thiscall
helix::nasdaq::nordic_itch_handler::is_rth_timestamp(nordic_itch_handler *this,uint64_t timestamp)

{
  return timestamp - 32400000 < 30300000;
}

Assistant:

bool nordic_itch_handler::is_rth_timestamp(uint64_t timestamp) const
{
    using namespace std::chrono_literals;
    using namespace std::chrono;
    // FIXME: This is valid only for Stockholm and Helsinki equities.
    constexpr uint64_t rth_start = duration_cast<milliseconds>(9h).count();
    constexpr uint64_t rth_end   = duration_cast<milliseconds>(17h + 25min).count();
    return timestamp >= rth_start && timestamp < rth_end;
}